

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCodeAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::writeValueTo
          (TypedAttribute<Imf_2_5::TimeCode> *this,OStream *os,int version)

{
  OStream *in_RSI;
  TimeCode *in_RDI;
  uint in_stack_ffffffffffffffcc;
  
  TimeCode::timeAndFlags(in_RDI,(Packing)((ulong)in_RSI >> 0x20));
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffffcc);
  TimeCode::userData(in_RDI + 1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void
TimeCodeAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.timeAndFlags());
    Xdr::write <StreamIO> (os, _value.userData());
}